

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O3

void TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::main(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  TPZVec<long> DestInd3;
  TPZVec<long> DestInd2;
  TPZVec<long> DestInd1;
  TPZVec<int> NumConnected;
  TPZFMatrix<double> KEl1;
  TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> TestFront;
  TPZFMatrix<double> local_4c8;
  _func_int **local_438;
  _func_int **local_430;
  double local_428;
  TPZVec<long> local_420;
  TPZVec<long> local_400;
  TPZVec<long> local_3e0;
  TPZVec<int> local_3c0;
  TPZFMatrix<double> local_3a0;
  TPZFMatrix<double> local_310;
  TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> local_280;
  
  local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_3a0.fElem = (double *)0x0;
  local_3a0.fGiven = (double *)0x0;
  local_3a0.fSize = 0;
  TPZVec<int>::TPZVec(&local_3a0.fPivot.super_TPZVec<int>,0);
  local_3a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3a0.fPivot.super_TPZVec<int>.fStore = local_3a0.fPivot.fExtAlloc;
  local_3a0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3a0.fWork.fStore = (double *)0x0;
  local_3a0.fWork.fNElements = 0;
  local_3a0.fWork.fNAlloc = 0;
  local_3a0.fElem = (double *)operator_new__(0x20);
  if ((local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *local_3a0.fElem = 4.0;
  if (local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_3a0.fElem[local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] = 6.0;
  if ((local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_3a0.fElem[1] = 6.0;
  if ((local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_3a0.fElem[local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] = 12.0;
  TPZVec<long>::TPZVec(&local_3e0,2);
  *local_3e0.fStore = 0;
  local_3e0.fStore[1] = 1;
  local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 4;
  local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 4;
  local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_4c8.fElem = (double *)0x0;
  local_4c8.fGiven = (double *)0x0;
  local_4c8.fSize = 0;
  TPZVec<int>::TPZVec(&local_4c8.fPivot.super_TPZVec<int>,0);
  local_4c8.fPivot.super_TPZVec<int>.fStore = local_4c8.fPivot.fExtAlloc;
  local_4c8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_4c8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_4c8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_4c8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_4c8.fWork.fStore = (double *)0x0;
  local_4c8.fWork.fNElements = 0;
  local_4c8.fWork.fNAlloc = 0;
  local_4c8.fElem = (double *)operator_new__(0x80);
  if ((local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *local_4c8.fElem = 4.0;
  if (local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] = -6.0;
  if ((local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2] = 2.0;
  if ((local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 3] = 6.0;
  if ((local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] = 12.0;
  if ((local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + 1] = -6.0;
  if ((local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 3 + 1] = -12.0;
  if ((local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
     (local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_4c8.fElem[local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + 2] = 4.0;
  if ((2 < local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
     (3 < local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
    local_4c8.fElem[local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 3 + 2] = 6.0;
    if ((local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 4) ||
       (local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_438 = (_func_int **)&PTR__TPZManVector_01815498;
    local_430 = (_func_int **)&PTR__TPZFMatrix_018151d8;
    local_4c8.fElem[local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 3 + 3] = 12.0;
    lVar1 = 0;
    lVar2 = 0;
    lVar3 = lVar2;
    do {
      do {
        if (local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar2 ||
            local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar3) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_428 = local_4c8.fElem
                    [local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar2 + lVar3];
        if ((local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar2) ||
           (local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)
         ((long)local_4c8.fElem +
         lVar2 * 8 + lVar1 * local_4c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) = local_428
        ;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      lVar2 = lVar3 + 1;
      lVar1 = lVar1 + 8;
      lVar3 = lVar2;
    } while (lVar2 != 4);
    TPZVec<long>::TPZVec(&local_400,4);
    *local_400.fStore = 0;
    local_400.fStore[1] = 1;
    local_400.fStore[2] = 2;
    local_400.fStore[3] = 3;
    local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
    local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
    local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         local_430;
    local_310.fElem = (double *)0x0;
    local_310.fGiven = (double *)0x0;
    local_310.fSize = 0;
    TPZVec<int>::TPZVec(&local_310.fPivot.super_TPZVec<int>,0);
    local_310.fPivot.super_TPZVec<int>.fStore = local_310.fPivot.fExtAlloc;
    local_310.fPivot.super_TPZVec<int>._vptr_TPZVec = local_438;
    local_310.fPivot.super_TPZVec<int>.fNElements = 0;
    local_310.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_310.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_310.fWork.fStore = (double *)0x0;
    local_310.fWork.fNElements = 0;
    local_310.fWork.fNAlloc = 0;
    local_310.fElem = (double *)operator_new__(0x20);
    if ((local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
       (local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    *local_310.fElem = 3.0;
    if (local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_310.fElem[local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] = 3.0;
    if ((1 < local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
       (0 < local_3a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
      local_3a0.fElem[1] = 3.0;
      if ((1 < local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
         (1 < local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
        local_310.fElem[local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] = 6.0;
        TPZVec<long>::TPZVec(&local_420,2);
        *local_420.fStore = 2;
        local_420.fStore[1] = 3;
        TPZFrontMatrix(&local_280,4);
        TPZVec<int>::TPZVec(&local_3c0,4);
        local_3c0.fStore[0] = 2;
        local_3c0.fStore[1] = 2;
        local_3c0.fStore[2] = 2;
        local_3c0.fStore[3] = 2;
        SetNumElConnected(&local_280,&local_3c0);
        SymbolicAddKel(&local_280,&local_3e0);
        SymbolicAddKel(&local_280,&local_400);
        SymbolicAddKel(&local_280,&local_420);
        TPZFrontNonSym<double>::AllocData(&local_280.fFront);
        local_280.fLastDecomposed = -1;
        SetNumElConnected(&local_280,&local_3c0);
        AddKel(&local_280,&local_3a0,&local_3e0);
        AddKel(&local_280,&local_4c8,&local_400);
        AddKel(&local_280,&local_310,&local_420);
        local_3c0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
        if (local_3c0.fStore != (int *)0x0) {
          operator_delete__(local_3c0.fStore);
        }
        ~TPZFrontMatrix(&local_280,
                        &TPZFrontMatrix<double,TPZFileEqnStorage<double>,TPZFrontNonSym<double>>::
                         VTT);
        local_420._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (local_420.fStore != (long *)0x0) {
          operator_delete__(local_420.fStore);
        }
        TPZFMatrix<double>::~TPZFMatrix(&local_310);
        local_400._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (local_400.fStore != (long *)0x0) {
          operator_delete__(local_400.fStore);
        }
        TPZFMatrix<double>::~TPZFMatrix(&local_4c8);
        local_3e0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (local_3e0.fStore != (long *)0x0) {
          operator_delete__(local_3e0.fStore);
        }
        TPZFMatrix<double>::~TPZFMatrix(&local_3a0);
        return;
      }
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::main()
{
	TPZFMatrix<TVar> KEl1(2,2);
	KEl1(0,0)=4.;
	KEl1(0,1)=6.;
	KEl1(1,0)=6.;
	KEl1(1,1)=12.;
	TPZVec<int64_t> DestInd1(2);
	DestInd1[0]=0;
	DestInd1[1]=1;
	
	
	TPZFMatrix<TVar> KEl2(4,4);
	KEl2(0,0)=4.;
	KEl2(0,1)=-6.;
	KEl2(0,2)=2.;
	KEl2(0,3)=6.;
	
	KEl2(1,1)=12;
	KEl2(1,2)=-6.;
	KEl2(1,3)=-12.;
	
	KEl2(2,2)=4.;
	KEl2(2,3)=6.;
	
	KEl2(3,3)=12.;
	
	int i, j;
	for(i=0;i<4;i++) {
		for(j=i;j<4;j++) KEl2(j,i)=KEl2(i,j);
	}
	
	TPZVec<int64_t> DestInd2(4);
	DestInd2[0]=0;
	DestInd2[1]=1;
	DestInd2[2]=2;
	DestInd2[3]=3;

	TPZFMatrix<TVar> KEl3(2,2);
	KEl3(0,0)=3.;
	KEl3(0,1)=3.;
	KEl1(1,0)=3.;
	KEl3(1,1)=6.;
	
	TPZVec<int64_t> DestInd3(2);
	DestInd3[0]=2;
	DestInd3[1]=3;

	TPZFrontMatrix TestFront(4);
	
	TPZVec<int> NumConnected(4);
	for(i=0;i<4;i++) NumConnected[i]=2;
	
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.SymbolicAddKel(DestInd1);
	TestFront.SymbolicAddKel(DestInd2);
	TestFront.SymbolicAddKel(DestInd3);
	
	TestFront.AllocData();
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.AddKel(KEl1,DestInd1);
	TestFront.AddKel(KEl2,DestInd2);
	TestFront.AddKel(KEl3,DestInd3);
}